

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

bool __thiscall Am_Value_List::Member(Am_Value_List *this,Am_Wrapper *value)

{
  uint *puVar1;
  uint uVar2;
  Am_List_Item *pAVar3;
  Am_List_Item *this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  pAVar3 = this->item;
  this_00 = pAVar3;
  do {
    if (this_00 == (Am_List_Item *)0x0) {
      this->item = pAVar3;
      bVar5 = false;
      bVar4 = false;
      bVar6 = false;
      if (value != (Am_Wrapper *)0x0) {
        puVar1 = &value->refs;
        *puVar1 = *puVar1 - 1;
        uVar2 = *puVar1;
joined_r0x0022b7bf:
        bVar6 = bVar4;
        if (uVar2 == 0) {
          (*(value->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])(value);
          bVar6 = bVar5;
        }
      }
      return bVar6;
    }
    bVar4 = Am_Value::operator==(&this_00->super_Am_Value,value);
    if (bVar4) {
      if (value == (Am_Wrapper *)0x0) {
        return true;
      }
      puVar1 = &value->refs;
      *puVar1 = *puVar1 - 1;
      uVar2 = *puVar1;
      bVar5 = true;
      bVar4 = true;
      goto joined_r0x0022b7bf;
    }
    this_00 = this->item->next;
    this->item = this_00;
  } while( true );
}

Assistant:

bool
Am_Value_List::Member(Am_Wrapper *value)
{
  Am_List_Item *old_item = item;
  while (item) {
    if (*item == value) {
      if (value)
        value->Release();
      return true;
    }
    item = item->next;
  }
  item = old_item;
  if (value)
    value->Release();
  return false;
}